

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::Thread(Thread *this,Store *store,Options *options)

{
  Stream *pSVar1;
  TraceSource *pTVar2;
  TraceSource *pTVar3;
  
  (this->super_Object).kind_ = Thread;
  *(undefined8 *)&(this->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Object).host_info_ = (void *)0x0;
  (this->super_Object).self_.index = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Thread_002c8ae8;
  (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->store_ = store;
  (this->trace_source_)._M_t.
  super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl =
       (TraceSource *)0x0;
  this->inst_ = (Instance *)0x0;
  this->mod_ = (Module *)0x0;
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::reserve
            (&this->frames_,(ulong)options->call_stack_size);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::reserve
            (&this->values_,(ulong)options->value_stack_size);
  pSVar1 = options->trace_stream;
  this->trace_stream_ = pSVar1;
  if (pSVar1 != (Stream *)0x0) {
    pTVar3 = (TraceSource *)operator_new(0x10);
    (pTVar3->super_TraceSource)._vptr_TraceSource = (_func_int **)&PTR__TraceSource_002c8b10;
    pTVar3->thread_ = this;
    pTVar2 = (this->trace_source_)._M_t.
             super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
             .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl;
    (this->trace_source_)._M_t.
    super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl = pTVar3;
    if (pTVar2 != (TraceSource *)0x0) {
      (*(pTVar2->super_TraceSource)._vptr_TraceSource[1])();
      return;
    }
  }
  return;
}

Assistant:

Thread::Thread(Store& store, const Options& options)
    : Object(skind), store_(store) {
  frames_.reserve(options.call_stack_size);
  values_.reserve(options.value_stack_size);
  trace_stream_ = options.trace_stream;
  if (options.trace_stream) {
    trace_source_ = MakeUnique<TraceSource>(this);
  }
}